

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

IntrusiveList<SynCallArgument> ParseCallArguments(ParseContext *ctx)

{
  IntrusiveList<SynCallArgument> IVar1;
  int iVar2;
  SynCallArgument *pSVar3;
  Lexeme *pLVar4;
  undefined4 extraout_var;
  SynBase *this;
  bool bVar5;
  bool bVar6;
  IntrusiveList<SynCallArgument> arguments;
  IntrusiveList<SynCallArgument> local_38;
  undefined4 extraout_var_00;
  
  local_38.head = (SynCallArgument *)0x0;
  local_38.tail = (SynCallArgument *)0x0;
  pSVar3 = ParseCallArgument(ctx);
  if (pSVar3 != (SynCallArgument *)0x0) {
    IntrusiveList<SynCallArgument>::push_back(&local_38,pSVar3);
    pLVar4 = ctx->currentLexeme;
    if (pLVar4->type == lex_comma) {
      bVar5 = pSVar3->name != (SynIdentifier *)0x0;
      do {
        ctx->currentLexeme = pLVar4 + 1;
        pSVar3 = ParseCallArgument(ctx);
        if (pSVar3 == (SynCallArgument *)0x0) {
          anon_unknown.dwarf_169315::Report
                    (ctx,ctx->currentLexeme,
                     "ERROR: expression not found after \',\' in function argument list");
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar3 = (SynCallArgument *)CONCAT44(extraout_var,iVar2);
          pLVar4 = ctx->currentLexeme;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
          this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
          SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
          this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
          SynBase::SynBase((SynBase *)pSVar3,0x18,pLVar4,pLVar4);
          (pSVar3->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6a20;
          pSVar3->name = (SynIdentifier *)0x0;
          pSVar3->value = this;
          IntrusiveList<SynCallArgument>::push_back(&local_38,pSVar3);
          break;
        }
        if (bVar5) {
          bVar6 = true;
          if (pSVar3->name == (SynIdentifier *)0x0) {
            anon_unknown.dwarf_169315::Report
                      (ctx,ctx->currentLexeme,"ERROR: function argument name expected after \',\'");
            break;
          }
        }
        else {
          bVar6 = pSVar3->name != (SynIdentifier *)0x0;
        }
        bVar5 = (bool)(bVar5 | bVar6);
        IntrusiveList<SynCallArgument>::push_back(&local_38,pSVar3);
        pLVar4 = ctx->currentLexeme;
      } while (pLVar4->type == lex_comma);
    }
  }
  IVar1.tail = local_38.tail;
  IVar1.head = local_38.head;
  return IVar1;
}

Assistant:

IntrusiveList<SynCallArgument> ParseCallArguments(ParseContext &ctx)
{
	IntrusiveList<SynCallArgument> arguments;

	if(SynCallArgument *argument = ParseCallArgument(ctx))
	{
		arguments.push_back(argument);

		bool namedCall = argument->name != NULL;

		while(ctx.Consume(lex_comma))
		{
			argument = ParseCallArgument(ctx);

			if(!argument)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ',' in function argument list");

				arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(ctx.Current(), ctx.Current(), NULL, new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current())));
				break;
			}

			if(namedCall && !argument->name)
			{
				Report(ctx, ctx.Current(), "ERROR: function argument name expected after ','");

				break;
			}

			namedCall |= argument->name != NULL;

			arguments.push_back(argument);
		}
	}

	return arguments;
}